

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

bool __thiscall
ON_SN_BLOCK::IsValidBlock
          (ON_SN_BLOCK *this,ON_TextLog *textlog,SN_ELEMENT ***hash_table,
          ON__UINT32 hash_block_count,ON__UINT64 *active_id_count)

{
  SN_ELEMENT *p_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 *puVar4;
  ulong uVar5;
  bool bVar6;
  ON__UINT32 OVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  ON__UINT64 *p;
  
  uVar1 = this->m_count;
  if (uVar1 < 0x2001) {
    uVar2 = this->m_purged;
    uVar9 = (ulong)uVar2;
    if (uVar2 <= uVar1) {
      if ((uVar1 < 2) && (this->m_sorted != 1)) {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",(ulong)uVar1
                           );
        }
      }
      else {
        if (uVar1 == 0) {
          if (this->m_sn0 == 0) {
            if (this->m_sn1 == 0) {
              return true;
            }
            if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
            pcVar11 = "ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n";
          }
          else {
            if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
            pcVar11 = "ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n";
          }
        }
        else {
          if ((this->m_sn0 <= this->m_sn1) &&
             ((uVar1 <= uVar2 || ((ulong)(uVar1 + ~uVar2) <= this->m_sn1 - this->m_sn0)))) {
            lVar12 = 0;
            uVar10 = 0;
            uVar13 = 0;
            uVar9 = 0;
LAB_004cefbb:
            p_00 = this->m_sn + uVar13;
            if (this->m_sn[uVar13].m_sn_active != '\0') {
              if (p_00->m_id_active == '\0') goto LAB_004cf090;
              lVar3._0_4_ = (p_00->m_id).Data1;
              lVar3._4_2_ = (p_00->m_id).Data2;
              lVar3._6_2_ = (p_00->m_id).Data3;
              if ((lVar3 == 0) && (*(long *)(p_00->m_id).Data4 == 0)) {
                if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
                pcVar11 = "ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n";
              }
              else {
                OVar7 = ON_CRC32(0,0x10,p_00);
                if (OVar7 == p_00->m_id_crc32) {
                  lVar12 = lVar12 + 1;
                  if (hash_table != (SN_ELEMENT ***)0x0) {
                    puVar8 = (undefined8 *)
                             ((ulong)((OVar7 / 0xffa + (OVar7 / 0xff4024) * -0xffa) * 8) +
                             (long)hash_table[(ulong)OVar7 % (ulong)hash_block_count]);
                    do {
                      puVar4 = (undefined1 *)*puVar8;
                      if (puVar4 == (undefined1 *)0x0) break;
                      puVar8 = (undefined8 *)(puVar4 + 0x20);
                    } while ((SN_ELEMENT *)puVar4 != p_00);
                    if (puVar4 != (undefined1 *)0x0) goto LAB_004cf090;
                    if (textlog != (ON_TextLog *)0x0) {
                      pcVar11 = 
                      "ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n"
                      ;
                      goto LAB_004cf1dc;
                    }
                    goto LAB_004cef13;
                  }
                  goto LAB_004cf090;
                }
                if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
                pcVar11 = 
                "ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n"
                ;
              }
LAB_004cf1dc:
              ON_TextLog::Print(textlog,pcVar11,uVar13);
              goto LAB_004cef13;
            }
            if (p_00->m_id_active != '\0') {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n";
                goto LAB_004cf1dc;
              }
              goto LAB_004cef13;
            }
            uVar10 = uVar10 + 1;
LAB_004cf090:
            uVar5 = p_00->m_sn;
            if (uVar5 < this->m_sn0) {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d] < m_sn0.\n";
                goto LAB_004cf1dc;
              }
              goto LAB_004cef13;
            }
            if (this->m_sn1 < uVar5) {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d] > m_sn1.\n";
                goto LAB_004cf1dc;
              }
              goto LAB_004cef13;
            }
            if ((this->m_sorted != 0) && (bVar6 = uVar5 <= uVar9, uVar9 = uVar5, bVar6)) {
              if (textlog != (ON_TextLog *)0x0) {
                ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",uVar13,uVar13 - 1);
              }
              goto LAB_004cef13;
            }
            uVar13 = uVar13 + 1;
            if (this->m_count <= uVar13) goto code_r0x004cf0d2;
            goto LAB_004cefbb;
          }
          if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
          pcVar11 = "ON_SN_BLOCK m_sn1 < m_sn0.\n";
        }
        ON_TextLog::Print(textlog,pcVar11);
      }
      goto LAB_004cef13;
    }
    if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
    pcVar11 = "ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n";
    uVar10 = (ulong)uVar1;
  }
  else {
    if (textlog == (ON_TextLog *)0x0) goto LAB_004cef13;
    pcVar11 = "ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n";
    uVar10 = 0x2000;
    uVar9 = (ulong)uVar1;
  }
  ON_TextLog::Print(textlog,pcVar11,uVar9,uVar10);
LAB_004cef13:
  bVar6 = ON_IsNotValid();
  return bVar6;
code_r0x004cf0d2:
  if (uVar10 == this->m_purged) {
    if (active_id_count != (ON__UINT64 *)0x0) {
      *active_id_count = *active_id_count + lVar12;
    }
    return true;
  }
  if (textlog != (ON_TextLog *)0x0) {
    ON_TextLog::Print(textlog,"ON_SN_BLOCK m_purged = %u (should be %u)\n");
  }
  goto LAB_004cef13;
}

Assistant:

bool ON_SN_BLOCK::IsValidBlock(
  ON_TextLog* textlog, 
  struct ON_SerialNumberMap::SN_ELEMENT*const*const* hash_table,
  ON__UINT32 hash_block_count,
  ON__UINT64* active_id_count
  ) const
{
  ON__UINT64 sn0, sn;
  size_t i, pc, aidcnt;

  if ( m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n",
                      m_count,ON_SN_BLOCK::SN_BLOCK_CAPACITY);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_purged > m_count )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n",
                      m_purged,m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count < 2 && 1 != m_sorted )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( 0 == m_count )
  {
    if ( 0 != m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( 0 != m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    return true;
  }

  if ( m_sn1 < m_sn0 )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count > m_purged )
  {
    if ( m_sn1 - m_sn0 < m_count-m_purged-1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
  }

  sn0 = 0;
  pc = 0;
  aidcnt = 0;
  for (i = 0; i < m_count; i++)
  {
    // validate m_sn_active and m_id_active flags
    if (0 == m_sn[i].m_sn_active)
    {
      // The element serial number is not active.
      // The id must also be not active.
      pc++;
      if ( 0 != m_sn[i].m_id_active )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }
    else if ( 0 != m_sn[i].m_id_active )
    {
      // The element has active serial number and active id.
      // It must have a nonzero m_id and be in the hash table.
      aidcnt++;
      if ( IdIsNotNil(&m_sn[i].m_id) )
      {
        const ON__UINT32 id_crc32 = IdCRC32(&m_sn[i].m_id);
        if (id_crc32 != m_sn[i].m_id_crc32)
        {
          if (textlog)
            textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n", i);
          return ON_SerialNumberMap_IsNotValidBlock();
        }
        if (nullptr != hash_table)
        {
          const ON_SerialNumberMap::SN_ELEMENT* e = nullptr;
          for (e = hash_table[id_crc32 % hash_block_count][(id_crc32/ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY]; 0 != e; e = e->m_next)
          {
            if (e == &m_sn[i])
            {
              // found m_sn[i] in the hash table
              break;
            }
          }
          if (nullptr == e)
          {
            // m_sn[i] is not in the hash table but m_id_active indicates
            // it should be.
            if (textlog)
              textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n", i);
            return ON_SerialNumberMap_IsNotValidBlock();
          }
        }
      }
      else 
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }

    // verify the serial number is in the range m_sn0 to m_sn1
    sn = m_sn[i].m_sn;
    if ( sn < m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] < m_sn0.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( sn > m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn1.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }

    if ( m_sorted )
    {
      // Verify this sn is bigger than the previous one
      if (sn <= sn0 )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",i,i-1);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
      sn0 = sn;
    }
  }

  if ( pc != m_purged )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be %u)\n",m_purged,pc);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  // Update the active id count to include
  // the active ids from this block.
  if ( 0 != active_id_count )
    *active_id_count += aidcnt;

  return true;
}